

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O2

void __thiscall
variant_visit_type_index_Test::~variant_visit_type_index_Test(variant_visit_type_index_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(variant, visit_type_index) {
    using visit::C;
    using visit::D;

    Variant<C, D> v{};

    v.emplace<C>();
    EXPECT_EQ(v.visit([](auto a) { return a.value; }), C::value);

    v.emplace<D>();
    EXPECT_EQ(v.visit([](auto a) { return a.value; }), D::value);
}